

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

bool rapidxml::internal::compare<char>
               (char *p1,size_t size1,char *p2,size_t size2,bool case_sensitive)

{
  char *end_1;
  char *end;
  bool case_sensitive_local;
  size_t size2_local;
  char *p2_local;
  size_t size1_local;
  char *p1_local;
  
  if (size1 == size2) {
    size2_local = (size_t)p2;
    size1_local = (size_t)p1;
    if (case_sensitive) {
      for (; size1_local < p1 + size1; size1_local = size1_local + 1) {
        if (*(char *)size1_local != *(char *)size2_local) {
          return false;
        }
        size2_local = size2_local + 1;
      }
    }
    else {
      for (; size1_local < p1 + size1; size1_local = size1_local + 1) {
        if (lookup_tables<0>::lookup_upcase[*(byte *)size1_local] !=
            lookup_tables<0>::lookup_upcase[*(byte *)size2_local]) {
          return false;
        }
        size2_local = size2_local + 1;
      }
    }
    p1_local._7_1_ = true;
  }
  else {
    p1_local._7_1_ = false;
  }
  return p1_local._7_1_;
}

Assistant:

inline bool compare(const Ch *p1, std::size_t size1, const Ch *p2, std::size_t size2, bool case_sensitive)
        {
            if (size1 != size2)
                return false;
            if (case_sensitive)
            {
                for (const Ch *end = p1 + size1; p1 < end; ++p1, ++p2)
                    if (*p1 != *p2)
                        return false;
            }
            else
            {
                for (const Ch *end = p1 + size1; p1 < end; ++p1, ++p2)
                    if (lookup_tables<0>::lookup_upcase[static_cast<unsigned char>(*p1)] != lookup_tables<0>::lookup_upcase[static_cast<unsigned char>(*p2)])
                        return false;
            }
            return true;
        }